

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O1

void __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
update_prop_desc_when_mapped
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          int node,vector<int,_std::allocator<int>_> *count_mapped_desc,
          vector<int,_std::allocator<int>_> *propagate_mapped_desc_count,
          vector<int,_std::allocator<int>_> *parent,int input_size)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  
  if (node < input_size + -1) {
    piVar3 = (parent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar1 = (count_mapped_desc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + piVar3[node];
    *piVar1 = *piVar1 + 1;
    piVar1 = (propagate_mapped_desc_count->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + piVar3[node];
    *piVar1 = *piVar1 + 1;
  }
  piVar3 = (propagate_mapped_desc_count->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar3[node];
  if (0 < iVar2) {
    if (node < input_size + -1) {
      piVar4 = (parent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (count_mapped_desc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + piVar4[node];
      *piVar1 = *piVar1 + iVar2;
      piVar3[piVar4[node]] = piVar3[piVar4[node]] + iVar2;
    }
    piVar3[node] = 0;
  }
  return;
}

Assistant:

void LGMTreeIndex<CostModel, TreeIndex>::update_prop_desc_when_mapped(
    const int node, std::vector<int>& count_mapped_desc,
    std::vector<int>& propagate_mapped_desc_count,
    const std::vector<int>& parent, const int input_size) const {
  if (node < input_size - 1) { // Root has no parent nor the right leaf, and
                               // the nodes of dummy mapping in fill_gaps_in_mapping
                               // do not exist.
    count_mapped_desc[parent[node]] += 1;
    propagate_mapped_desc_count[parent[node]] += 1;
  }
  update_prop_desc_when_not_mapped(node, count_mapped_desc, propagate_mapped_desc_count, parent, input_size);
}